

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O1

cf_errno_t cf_mutex_lock(cf_mutex_t *mutex)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)mutex);
  return (cf_errno_t)(iVar1 != 0);
}

Assistant:

cf_errno_t cf_mutex_lock(cf_mutex_t* mutex) {
#ifdef CF_OS_WIN
    if (!mutex) return CF_EPARAM;

    // WAIT_TIMEOUT 
    if (WAIT_OBJECT_0 == WaitForSingleObject(*mutex, INFINITE)) return CF_OK;
    else return CF_NOK;
#else
    if(pthread_mutex_lock(mutex) == 0) return CF_OK;
    else return CF_NOK;
#endif
}